

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexWidth4Filter::buildKernelAxis
          (PtexWidth4Filter *this,int8_t *k_ureslog2,int *k_u,int *k_uw,float *ku,float u,float uw,
          int f_ureslog2)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int i_5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float f_4;
  float f;
  float fVar10;
  float f_3;
  float fVar11;
  float fVar12;
  float f_2;
  float f_1;
  
  fVar1 = (float)(f_ureslog2 * -0x800000 + 0x3f800000);
  if (uw <= fVar1) {
    uw = fVar1;
  }
  bVar4 = (byte)((uint)uw >> 0x17) ^ 0x7f;
  fVar1 = (float)(1 << (bVar4 & 0x1f));
  *k_ureslog2 = bVar4;
  if ((this->super_PtexSeparableFilter)._options.lerp == false) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = (uw - 1.0 / fVar1) / (1.0 / fVar1);
  }
  fVar12 = 1.0 - fVar10;
  if (0.25 <= uw) {
    if (0.5 <= uw) {
      if (1.0 <= uw) {
        *k_ureslog2 = '\0';
        *k_uw = 2;
        fVar1 = floorf(u + -0.5);
        fVar10 = ABS((u + -0.5) - fVar1);
        *k_u = (int)fVar1;
        fVar1 = 0.0;
        if (fVar10 < 1.0) {
          fVar1 = (fVar10 + fVar10 + -3.0) * fVar10 * fVar10 + 1.0;
        }
        *ku = fVar1;
        ku[1] = 1.0 - fVar1;
      }
      else {
        *k_ureslog2 = '\x01';
        fVar1 = floorf(u + -0.5);
        *k_u = (int)fVar1 * 2;
        *k_uw = 4;
        iVar2 = *k_u;
        fVar1 = 1.0 / (uw * 1.5 + 0.5);
        for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 2) {
          fVar7 = (float)(int)uVar3 + ((float)iVar2 - (u + u + -0.5));
          fVar8 = ABS(fVar1 * fVar7);
          fVar11 = 0.0;
          fVar9 = 0.0;
          if (fVar8 < 1.0) {
            fVar9 = (fVar8 + fVar8 + -3.0) * fVar8 * fVar8 + 1.0;
          }
          fVar8 = ABS((fVar7 + 1.0) * fVar1);
          if (fVar8 < 1.0) {
            fVar11 = (fVar8 + fVar8 + -3.0) * fVar8 * fVar8 + 1.0;
          }
          fVar7 = ABS((fVar7 + fVar7 + 1.0) * 0.5 * fVar1);
          fVar8 = 0.0;
          if (fVar7 < 1.0) {
            fVar8 = (fVar7 + fVar7 + -3.0) * fVar7 * fVar7 + 1.0;
          }
          *(ulong *)(ku + uVar3) =
               CONCAT44(fVar8 * fVar10 + fVar11 * fVar12,fVar8 * fVar10 + fVar9 * fVar12);
        }
      }
    }
    else {
      *k_ureslog2 = '\x02';
      fVar9 = u * 4.0 + -0.5;
      fVar1 = ceilf(fVar9 + -2.0);
      fVar7 = ceilf(fVar9 + 2.0);
      uVar5 = (int)fVar1 & 0xfffffffe;
      *k_u = uVar5;
      iVar2 = ((int)fVar7 + 1U & 0xfffffffe) - uVar5;
      *k_uw = iVar2;
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 2) {
        fVar1 = (float)(int)lVar6 + ((float)(int)uVar5 - fVar9);
        fVar7 = (*this->_k)(fVar1,this->_c);
        fVar11 = (*this->_k)(fVar1 + 1.0,this->_c);
        fVar8 = ABS((fVar1 + fVar1 + 1.0) * 0.25 * (1.0 / (uw + 0.75)));
        fVar1 = 0.0;
        if (fVar8 < 1.0) {
          fVar1 = (fVar8 + fVar8 + -3.0) * fVar8 * fVar8 + 1.0;
        }
        *(ulong *)(ku + lVar6) =
             CONCAT44(fVar1 * fVar10 + fVar11 * fVar12,fVar1 * fVar10 + fVar7 * fVar12);
        iVar2 = *k_uw;
      }
    }
  }
  else {
    fVar11 = u * fVar1 + -0.5;
    fVar1 = uw * fVar1;
    fVar7 = ceilf(fVar11 - (fVar1 + fVar1));
    uVar5 = (uint)fVar7;
    fVar7 = ceilf(fVar1 + fVar1 + fVar11);
    fVar9 = 1.0 / fVar1;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      uVar5 = uVar5 & 0xfffffffe;
      *k_u = uVar5;
      iVar2 = ((int)fVar7 + 1U & 0xfffffffe) - uVar5;
      *k_uw = iVar2;
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 2) {
        fVar1 = (float)(int)lVar6 * fVar9 + ((float)(int)uVar5 - fVar11) * fVar9;
        fVar7 = (*this->_k)(fVar1,this->_c);
        fVar8 = (*this->_k)(fVar9 + fVar1,this->_c);
        fVar1 = (*this->_k)((fVar1 + fVar9 + fVar1) * 0.5,this->_c);
        *(ulong *)(ku + lVar6) =
             CONCAT44(fVar1 * fVar10 + fVar8 * fVar12,fVar1 * fVar10 + fVar7 * fVar12);
        iVar2 = *k_uw;
      }
    }
    else {
      *k_u = uVar5;
      iVar2 = (int)fVar7 - uVar5;
      *k_uw = iVar2;
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
        fVar10 = (*this->_k)((float)(int)lVar6 * fVar9 + ((float)(int)uVar5 - fVar11) / fVar1,
                             this->_c);
        ku[lVar6] = fVar10;
        iVar2 = *k_uw;
      }
    }
  }
  return;
}

Assistant:

void buildKernelAxis(int8_t& k_ureslog2, int& k_u, int& k_uw, float* ku,
                         float u, float uw, int f_ureslog2)
    {
        // build 1 axis (note: "u" labels may repesent either u or v axis)

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(f_ureslog2));

        // compute desired texture res based on filter width
        k_ureslog2 = (int8_t)PtexUtils::calcResFromWidth(uw);
        int resu = 1 << k_ureslog2;
        float uwlo = 1.0f/(float)resu; // smallest filter width for this res

        // compute lerp weights (amount to blend towards next-lower res)
        float lerp2 = _options.lerp ? (uw-uwlo)/uwlo : 0;
        float lerp1 = 1.0f-lerp2;

        // adjust for large filter widths
        if (uw >= .25f) {
            if (uw < .5f) {
                k_ureslog2 = 2;
                float upix = u * 4.0f - 0.5f;
                int u1 = int(PtexUtils::ceil(upix - 2)), u2 = int(PtexUtils::ceil(upix + 2));
                u1 = u1 & ~1;       // round down to even pair
                u2 = (u2 + 1) & ~1; // round up to even pair
                k_u = u1;
                k_uw = u2-u1;
                float x1 = (float)u1-upix;
                for (int i = 0; i < k_uw; i+=2) {
                    float xa = x1 + (float)i, xb = xa + 1.0f, xc = (xa+xb)*0.25f;
                    // spread the filter gradually to approach the next-lower-res width
                    // at uw = .5, s = 1.0; at uw = 1, s = 0.8
                    float s = 1.0f/(uw + .75f);
                    float ka = _k(xa, _c), kb = _k(xb, _c), kc = blur(xc*s);
                    ku[i] = ka * lerp1 + kc * lerp2;
                    ku[i+1] = kb * lerp1 + kc * lerp2;
                }
                return;
            }
            else if (uw < 1) {
                k_ureslog2 = 1;
                float upix = u * 2.0f - 0.5f;
                k_u = int(PtexUtils::floor(u - .5f))*2;
                k_uw = 4;
                float x1 = (float)k_u-upix;
                for (int i = 0; i < k_uw; i+=2) {
                    float xa = x1 + (float)i, xb = xa + 1.0f, xc = (xa+xb)*0.5f;
                    // spread the filter gradually to approach the next-lower-res width
                    // at uw = .5, s = .8; at uw = 1, s = 0.5
                    float s = 1.0f/(uw*1.5f + .5f);
                    float ka = blur(xa*s), kb = blur(xb*s), kc = blur(xc*s);
                    ku[i] = ka * lerp1 + kc * lerp2;
                    ku[i+1] = kb * lerp1 + kc * lerp2;
                }
                return;
            }
            else {
                // use res 0 (1 texel per face) w/ no lerping
                // (future: use face-blended values for filter > 2)
                k_ureslog2 = 0;
                float upix = u - .5f;
                k_uw = 2;
                float ui = PtexUtils::floor(upix);
                k_u = int(ui);
                ku[0] = blur(upix-ui);
                ku[1] = 1-ku[0];
                return;
            }
        }

        // convert from normalized coords to pixel coords
        float upix = u * (float)resu - 0.5f;
        float uwpix = uw * (float)resu;

        // find integer pixel extent: [u,v] +/- [2*uw,2*vw]
        // (kernel width is 4 times filter width)
        float dupix = 2.0f*uwpix;
        int u1 = int(PtexUtils::ceil(upix - dupix)), u2 = int(PtexUtils::ceil(upix + dupix));

        if (lerp2) {
            // lerp kernel weights towards next-lower res
            // extend kernel width to cover even pairs
            u1 = u1 & ~1;
            u2 = (u2 + 1) & ~1;
            k_u = u1;
            k_uw = u2-u1;

            // compute kernel weights
            float step = 1.0f/uwpix, x1 = ((float)u1-upix)*(float)step;
            for (int i = 0; i < k_uw; i+=2) {
                float xa = x1 + (float)i*step, xb = xa + step, xc = (xa+xb)*0.5f;
                float ka = _k(xa, _c), kb = _k(xb, _c), kc = _k(xc, _c);
                ku[i] = ka * lerp1 + kc * lerp2;
                ku[i+1] = kb * lerp1 + kc * lerp2;
            }
        }
        else {
            k_u = u1;
            k_uw = u2-u1;
            // compute kernel weights
            float x1 = ((float)u1-upix)/uwpix, step = 1.0f/uwpix;
            for (int i = 0; i < k_uw; i++) ku[i] = _k(x1 + (float)i*step, _c);
        }
    }